

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O1

ExecutionResult __thiscall nigel::Lexer::postLexer(Lexer *this,CodeBase *base)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  element_type *peVar6;
  undefined8 uVar7;
  int iVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined7 uVar12;
  _List_node_base *p_Var11;
  size_t index;
  element_type *peVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Lexer *pLVar14;
  _List_node_base *p_Var15;
  list<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_> *lexerStruct;
  bool bVar16;
  bool bVar17;
  String identifier_2;
  String identifier;
  list<std::_List_iterator<std::shared_ptr<nigel::Token>_>,_std::allocator<std::_List_iterator<std::shared_ptr<nigel::Token>_>_>_>
  toRemove;
  Type local_320;
  undefined1 local_319;
  undefined1 local_318 [16];
  undefined1 local_308 [36];
  undefined4 local_2e4;
  undefined4 local_2e0;
  undefined4 local_2dc;
  undefined4 local_2d8;
  undefined4 local_2d4;
  undefined4 local_2d0;
  undefined4 local_2cc;
  undefined4 local_2c8;
  undefined4 local_2c4;
  undefined4 local_2c0;
  undefined4 local_2bc;
  undefined1 local_2b8 [48];
  element_type *local_288;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_280;
  int iStack_274;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_270 [2];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_260;
  long *local_250 [2];
  long local_240 [2];
  long *local_230 [2];
  long local_220 [2];
  long *local_210 [2];
  long local_200 [2];
  long *local_1f0 [2];
  long local_1e0 [2];
  long *local_1d0 [2];
  long local_1c0 [2];
  long *local_1b0 [2];
  long local_1a0 [2];
  long *local_190 [2];
  long local_180 [2];
  long *local_170 [2];
  long local_160 [2];
  long *local_150 [2];
  long local_140 [2];
  long *local_130 [2];
  long local_120 [2];
  long *local_110 [2];
  long local_100 [2];
  long *local_f0 [2];
  long local_e0 [2];
  long *local_d0 [2];
  long local_c0 [2];
  long *local_b0 [2];
  long local_a0 [2];
  long *local_90 [2];
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  local_288 = (element_type *)(local_2b8 + 0x28);
  local_280._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var11 = (base->lexerStruct).
            super__List_base<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_>
            ._M_impl._M_node.super__List_node_base._M_next;
  lexerStruct = &base->lexerStruct;
  peVar13 = local_288;
  do {
    local_2b8._32_8_ = p_Var11;
    local_2b8._40_8_ = peVar13;
    if (p_Var11 == (_List_node_base *)lexerStruct) {
      for (; peVar6 = (element_type *)local_2b8._40_8_,
          peVar13 != (element_type *)(local_2b8 + 0x28);
          peVar13 = (element_type *)(peVar13->_M_dataplus)._M_p) {
        std::__cxx11::
        list<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_>::
        _M_erase(lexerStruct,(_List_node_base *)(peVar13->field_2)._M_allocated_capacity);
      }
      while (peVar6 != (element_type *)(local_2b8 + 0x28)) {
        peVar13 = (element_type *)(peVar6->_M_dataplus)._M_p;
        operator_delete(peVar6,0x18);
        peVar6 = peVar13;
      }
      return success;
    }
    iVar8 = *(int *)&p_Var11[1]._M_next[1]._M_prev;
    if (iVar8 != 0x3b) {
      if (iVar8 == 0x18) {
        Token::as<nigel::Token_Operator>((Token *)local_308);
        local_2b8._0_8_ = local_2b8 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_2b8,
                   (_List_node_base *)
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_308._0_8_ + 0x50))->
                   _vptr__Sp_counted_base,
                   (long)&(*(_List_node_base **)
                            &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             (local_308._0_8_ + 0x50))->_M_use_count)->_M_next +
                   (long)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_308._0_8_ + 0x50))
                         ->_vptr__Sp_counted_base);
        if ((element_type *)local_308._8_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_308._8_8_);
        }
        if ((ulong)local_2b8._8_8_ < (element_type *)0x2) {
LAB_001685d8:
          this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var15 = (_List_node_base *)0x0;
        }
        else {
          std::__cxx11::string::substr((ulong)local_308,(ulong)local_2b8);
          iVar8 = std::__cxx11::string::compare((char *)local_308);
          if (iVar8 == 0) {
            bVar16 = true;
          }
          else {
            std::__cxx11::string::substr((ulong)local_50,(ulong)local_2b8);
            iVar8 = std::__cxx11::string::compare((char *)local_50);
            bVar16 = iVar8 == 0;
            if (local_50[0] != local_40) {
              operator_delete(local_50[0],local_40[0] + 1);
            }
          }
          pLVar14 = (Lexer *)local_308._0_8_;
          if ((Lexer *)local_308._0_8_ != (Lexer *)(local_308 + 0x10)) {
            operator_delete((void *)local_308._0_8_,
                            (ulong)((long)(_func_int ***)local_308._16_8_ + 1));
          }
          if (bVar16) {
            index = 3;
            if ((element_type *)0x3 < (ulong)local_2b8._8_8_) {
LAB_001683e1:
              splitToken(pLVar14,(String *)local_2b8,index,(iterator *)(local_2b8 + 0x20),
                         lexerStruct);
            }
          }
          else {
            std::__cxx11::string::substr((ulong)local_308,(ulong)local_2b8);
            iStack_274 = std::__cxx11::string::compare((char *)local_308);
            if (iStack_274 == 0) {
LAB_00167d5c:
              local_2bc = 0;
              local_2c0 = 0;
              local_2c4 = 0;
              local_2c8 = 0;
              local_2cc = 0;
              local_2d0 = 0;
              local_2d4 = 0;
              local_2d8 = 0;
              local_2dc = 0;
              local_2e0 = 0;
              local_2e4 = 0;
              bVar5 = false;
              bVar4 = false;
              bVar16 = false;
LAB_001680b7:
              bVar3 = false;
              bVar17 = true;
              bVar2 = false;
            }
            else {
              std::__cxx11::string::substr((ulong)local_90,(ulong)local_2b8);
              iVar8 = std::__cxx11::string::compare((char *)local_90);
              if (iVar8 == 0) goto LAB_00167d5c;
              std::__cxx11::string::substr((ulong)local_b0,(ulong)local_2b8);
              uVar9 = std::__cxx11::string::compare((char *)local_b0);
              if ((int)uVar9 == 0) {
                local_2bc = (undefined4)CONCAT71((int7)((ulong)uVar9 >> 8),1);
                local_2c0 = 0;
LAB_00168069:
                local_2c4 = 0;
LAB_00168071:
                local_2c8 = 0;
LAB_00168079:
                local_2cc = 0;
LAB_00168081:
                local_2d0 = 0;
LAB_00168089:
                local_2d4 = 0;
LAB_00168091:
                local_2d8 = 0;
LAB_00168099:
                local_2dc = 0;
LAB_001680a1:
                local_2e0 = 0;
LAB_001680a9:
                local_2e4 = 0;
LAB_001680ab:
                bVar5 = false;
LAB_001680ae:
                bVar4 = false;
LAB_001680b1:
                bVar16 = false;
                goto LAB_001680b7;
              }
              std::__cxx11::string::substr((ulong)local_d0,(ulong)local_2b8);
              uVar9 = std::__cxx11::string::compare((char *)local_d0);
              if ((int)uVar9 == 0) {
                uVar12 = (undefined7)((ulong)uVar9 >> 8);
                local_2bc = (undefined4)CONCAT71(uVar12,1);
                local_2c0 = (undefined4)CONCAT71(uVar12,1);
                goto LAB_00168069;
              }
              std::__cxx11::string::substr((ulong)local_f0,(ulong)local_2b8);
              uVar9 = std::__cxx11::string::compare((char *)local_f0);
              if ((int)uVar9 == 0) {
                uVar12 = (undefined7)((ulong)uVar9 >> 8);
                local_2bc = (undefined4)CONCAT71(uVar12,1);
                local_2c0 = (undefined4)CONCAT71(uVar12,1);
                local_2c4 = (undefined4)CONCAT71(uVar12,1);
                goto LAB_00168071;
              }
              std::__cxx11::string::substr((ulong)local_110,(ulong)local_2b8);
              uVar9 = std::__cxx11::string::compare((char *)local_110);
              if ((int)uVar9 == 0) {
                uVar12 = (undefined7)((ulong)uVar9 >> 8);
                local_2bc = (undefined4)CONCAT71(uVar12,1);
                local_2c0 = (undefined4)CONCAT71(uVar12,1);
                local_2c4 = (undefined4)CONCAT71(uVar12,1);
                local_2c8 = (undefined4)CONCAT71(uVar12,1);
                goto LAB_00168079;
              }
              std::__cxx11::string::substr((ulong)local_130,(ulong)local_2b8);
              uVar9 = std::__cxx11::string::compare((char *)local_130);
              if ((int)uVar9 == 0) {
                uVar12 = (undefined7)((ulong)uVar9 >> 8);
                local_2bc = (undefined4)CONCAT71(uVar12,1);
                local_2c0 = (undefined4)CONCAT71(uVar12,1);
                local_2c4 = (undefined4)CONCAT71(uVar12,1);
                local_2c8 = (undefined4)CONCAT71(uVar12,1);
                local_2cc = (undefined4)CONCAT71(uVar12,1);
                goto LAB_00168081;
              }
              std::__cxx11::string::substr((ulong)local_150,(ulong)local_2b8);
              uVar9 = std::__cxx11::string::compare((char *)local_150);
              if ((int)uVar9 == 0) {
                uVar12 = (undefined7)((ulong)uVar9 >> 8);
                local_2bc = (undefined4)CONCAT71(uVar12,1);
                local_2c0 = (undefined4)CONCAT71(uVar12,1);
                local_2c4 = (undefined4)CONCAT71(uVar12,1);
                local_2c8 = (undefined4)CONCAT71(uVar12,1);
                local_2cc = (undefined4)CONCAT71(uVar12,1);
                local_2d0 = (undefined4)CONCAT71(uVar12,1);
                goto LAB_00168089;
              }
              std::__cxx11::string::substr((ulong)local_170,(ulong)local_2b8);
              uVar9 = std::__cxx11::string::compare((char *)local_170);
              if ((int)uVar9 == 0) {
                uVar12 = (undefined7)((ulong)uVar9 >> 8);
                local_2bc = (undefined4)CONCAT71(uVar12,1);
                local_2c0 = (undefined4)CONCAT71(uVar12,1);
                local_2c4 = (undefined4)CONCAT71(uVar12,1);
                local_2c8 = (undefined4)CONCAT71(uVar12,1);
                local_2cc = (undefined4)CONCAT71(uVar12,1);
                local_2d0 = (undefined4)CONCAT71(uVar12,1);
                local_2d4 = (undefined4)CONCAT71(uVar12,1);
                goto LAB_00168091;
              }
              std::__cxx11::string::substr((ulong)local_190,(ulong)local_2b8);
              uVar9 = std::__cxx11::string::compare((char *)local_190);
              if ((int)uVar9 == 0) {
                uVar12 = (undefined7)((ulong)uVar9 >> 8);
                local_2bc = (undefined4)CONCAT71(uVar12,1);
                local_2c0 = (undefined4)CONCAT71(uVar12,1);
                local_2c4 = (undefined4)CONCAT71(uVar12,1);
                local_2c8 = (undefined4)CONCAT71(uVar12,1);
                local_2cc = (undefined4)CONCAT71(uVar12,1);
                local_2d0 = (undefined4)CONCAT71(uVar12,1);
                local_2d4 = (undefined4)CONCAT71(uVar12,1);
                local_2d8 = (undefined4)CONCAT71(uVar12,1);
                goto LAB_00168099;
              }
              std::__cxx11::string::substr((ulong)local_1b0,(ulong)local_2b8);
              uVar9 = std::__cxx11::string::compare((char *)local_1b0);
              if ((int)uVar9 == 0) {
                uVar12 = (undefined7)((ulong)uVar9 >> 8);
                local_2bc = (undefined4)CONCAT71(uVar12,1);
                local_2c0 = (undefined4)CONCAT71(uVar12,1);
                local_2c4 = (undefined4)CONCAT71(uVar12,1);
                local_2c8 = (undefined4)CONCAT71(uVar12,1);
                local_2cc = (undefined4)CONCAT71(uVar12,1);
                local_2d0 = (undefined4)CONCAT71(uVar12,1);
                local_2d4 = (undefined4)CONCAT71(uVar12,1);
                local_2d8 = (undefined4)CONCAT71(uVar12,1);
                local_2dc = (undefined4)CONCAT71(uVar12,1);
                goto LAB_001680a1;
              }
              std::__cxx11::string::substr((ulong)local_1d0,(ulong)local_2b8);
              uVar9 = std::__cxx11::string::compare((char *)local_1d0);
              if ((int)uVar9 == 0) {
                uVar12 = (undefined7)((ulong)uVar9 >> 8);
                local_2bc = (undefined4)CONCAT71(uVar12,1);
                local_2c0 = (undefined4)CONCAT71(uVar12,1);
                local_2c4 = (undefined4)CONCAT71(uVar12,1);
                local_2c8 = (undefined4)CONCAT71(uVar12,1);
                local_2cc = (undefined4)CONCAT71(uVar12,1);
                local_2d0 = (undefined4)CONCAT71(uVar12,1);
                local_2d4 = (undefined4)CONCAT71(uVar12,1);
                local_2d8 = (undefined4)CONCAT71(uVar12,1);
                local_2dc = (undefined4)CONCAT71(uVar12,1);
                local_2e0 = (undefined4)CONCAT71(uVar12,1);
                goto LAB_001680a9;
              }
              std::__cxx11::string::substr((ulong)local_1f0,(ulong)local_2b8);
              uVar9 = std::__cxx11::string::compare((char *)local_1f0);
              if ((int)uVar9 == 0) {
                uVar12 = (undefined7)((ulong)uVar9 >> 8);
                local_2bc = (undefined4)CONCAT71(uVar12,1);
                local_2c0 = (undefined4)CONCAT71(uVar12,1);
                local_2c4 = (undefined4)CONCAT71(uVar12,1);
                local_2c8 = (undefined4)CONCAT71(uVar12,1);
                local_2cc = (undefined4)CONCAT71(uVar12,1);
                local_2d0 = (undefined4)CONCAT71(uVar12,1);
                local_2d4 = (undefined4)CONCAT71(uVar12,1);
                local_2d8 = (undefined4)CONCAT71(uVar12,1);
                local_2dc = (undefined4)CONCAT71(uVar12,1);
                local_2e0 = (undefined4)CONCAT71(uVar12,1);
                local_2e4 = (undefined4)CONCAT71(uVar12,1);
                goto LAB_001680ab;
              }
              std::__cxx11::string::substr((ulong)local_210,(ulong)local_2b8);
              uVar9 = std::__cxx11::string::compare((char *)local_210);
              if ((int)uVar9 == 0) {
                uVar12 = (undefined7)((ulong)uVar9 >> 8);
                local_2bc = (undefined4)CONCAT71(uVar12,1);
                local_2c0 = (undefined4)CONCAT71(uVar12,1);
                local_2c4 = (undefined4)CONCAT71(uVar12,1);
                local_2c8 = (undefined4)CONCAT71(uVar12,1);
                local_2cc = (undefined4)CONCAT71(uVar12,1);
                local_2d0 = (undefined4)CONCAT71(uVar12,1);
                local_2d4 = (undefined4)CONCAT71(uVar12,1);
                local_2d8 = (undefined4)CONCAT71(uVar12,1);
                local_2dc = (undefined4)CONCAT71(uVar12,1);
                local_2e0 = (undefined4)CONCAT71(uVar12,1);
                local_2e4 = (undefined4)CONCAT71(uVar12,1);
                bVar5 = true;
                goto LAB_001680ae;
              }
              std::__cxx11::string::substr((ulong)local_230,(ulong)local_2b8);
              uVar9 = std::__cxx11::string::compare((char *)local_230);
              if ((int)uVar9 == 0) {
                uVar12 = (undefined7)((ulong)uVar9 >> 8);
                local_2bc = (undefined4)CONCAT71(uVar12,1);
                local_2c0 = (undefined4)CONCAT71(uVar12,1);
                local_2c4 = (undefined4)CONCAT71(uVar12,1);
                local_2c8 = (undefined4)CONCAT71(uVar12,1);
                local_2cc = (undefined4)CONCAT71(uVar12,1);
                local_2d0 = (undefined4)CONCAT71(uVar12,1);
                local_2d4 = (undefined4)CONCAT71(uVar12,1);
                local_2d8 = (undefined4)CONCAT71(uVar12,1);
                local_2dc = (undefined4)CONCAT71(uVar12,1);
                local_2e0 = (undefined4)CONCAT71(uVar12,1);
                local_2e4 = (undefined4)CONCAT71(uVar12,1);
                bVar5 = true;
                bVar4 = true;
                goto LAB_001680b1;
              }
              std::__cxx11::string::substr((ulong)local_250,(ulong)local_2b8);
              uVar9 = std::__cxx11::string::compare((char *)local_250);
              if ((int)uVar9 == 0) {
                uVar12 = (undefined7)((ulong)uVar9 >> 8);
                local_2bc = (undefined4)CONCAT71(uVar12,1);
                local_2c0 = (undefined4)CONCAT71(uVar12,1);
                local_2c4 = (undefined4)CONCAT71(uVar12,1);
                local_2c8 = (undefined4)CONCAT71(uVar12,1);
                local_2cc = (undefined4)CONCAT71(uVar12,1);
                local_2d0 = (undefined4)CONCAT71(uVar12,1);
                local_2d4 = (undefined4)CONCAT71(uVar12,1);
                local_2d8 = (undefined4)CONCAT71(uVar12,1);
                local_2dc = (undefined4)CONCAT71(uVar12,1);
                local_2e0 = (undefined4)CONCAT71(uVar12,1);
                local_2e4 = (undefined4)CONCAT71(uVar12,1);
                bVar5 = true;
                bVar4 = true;
                bVar16 = true;
                goto LAB_001680b7;
              }
              uVar9 = 0;
              std::__cxx11::string::substr((ulong)local_270,(ulong)local_2b8);
              uVar10 = std::__cxx11::string::compare((char *)local_270);
              if ((int)uVar10 == 0) {
                local_2bc = (undefined4)CONCAT71((int7)((ulong)uVar10 >> 8),1);
                bVar2 = false;
                uVar12 = (undefined7)((ulong)uVar9 >> 8);
                local_2c0 = (undefined4)CONCAT71(uVar12,1);
                local_2c4 = (undefined4)CONCAT71(uVar12,1);
                local_2c8 = (undefined4)CONCAT71(uVar12,1);
                local_2cc = (undefined4)CONCAT71(uVar12,1);
                local_2d0 = (undefined4)CONCAT71(uVar12,1);
                local_2d4 = (undefined4)CONCAT71(uVar12,1);
                local_2d8 = (undefined4)CONCAT71(uVar12,1);
                local_2dc = (undefined4)CONCAT71(uVar12,1);
                local_2e0 = (undefined4)CONCAT71(uVar12,1);
                local_2e4 = (undefined4)CONCAT71(uVar12,1);
                bVar5 = true;
                bVar4 = true;
                bVar16 = true;
                bVar17 = true;
                bVar3 = true;
              }
              else {
                std::__cxx11::string::substr((ulong)local_70,(ulong)local_2b8);
                uVar9 = std::__cxx11::string::compare((char *)local_70);
                bVar17 = (int)uVar9 == 0;
                uVar12 = (undefined7)((ulong)uVar9 >> 8);
                local_2bc = (undefined4)CONCAT71(uVar12,1);
                local_2c0 = (undefined4)CONCAT71(uVar12,1);
                local_2c4 = (undefined4)CONCAT71(uVar12,1);
                local_2c8 = (undefined4)CONCAT71(uVar12,1);
                local_2cc = (undefined4)CONCAT71(uVar12,1);
                local_2d0 = (undefined4)CONCAT71(uVar12,1);
                local_2d4 = (undefined4)CONCAT71(uVar12,1);
                local_2d8 = (undefined4)CONCAT71(uVar12,1);
                local_2dc = (undefined4)CONCAT71(uVar12,1);
                local_2e0 = (undefined4)CONCAT71(uVar12,1);
                local_2e4 = (undefined4)CONCAT71(uVar12,1);
                bVar5 = true;
                bVar4 = true;
                bVar16 = true;
                bVar3 = true;
                bVar2 = true;
              }
            }
            if ((bVar2) && (local_70[0] != local_60)) {
              operator_delete(local_70[0],local_60[0] + 1);
            }
            if ((bVar3) && (local_270[0]._M_pi != &local_260)) {
              operator_delete(local_270[0]._M_pi,
                              (ulong)((long)(_func_int ***)local_260._vptr__Sp_counted_base + 1));
            }
            if ((bVar16) && (local_250[0] != local_240)) {
              operator_delete(local_250[0],local_240[0] + 1);
            }
            if ((bVar4) && (local_230[0] != local_220)) {
              operator_delete(local_230[0],local_220[0] + 1);
            }
            if ((bVar5) && (local_210[0] != local_200)) {
              operator_delete(local_210[0],local_200[0] + 1);
            }
            if (((char)local_2e4 != '\0') && (local_1f0[0] != local_1e0)) {
              operator_delete(local_1f0[0],local_1e0[0] + 1);
            }
            if (((char)local_2e0 != '\0') && (local_1d0[0] != local_1c0)) {
              operator_delete(local_1d0[0],local_1c0[0] + 1);
            }
            if (((char)local_2dc != '\0') && (local_1b0[0] != local_1a0)) {
              operator_delete(local_1b0[0],local_1a0[0] + 1);
            }
            if (((char)local_2d8 != '\0') && (local_190[0] != local_180)) {
              operator_delete(local_190[0],local_180[0] + 1);
            }
            if (((char)local_2d4 != '\0') && (local_170[0] != local_160)) {
              operator_delete(local_170[0],local_160[0] + 1);
            }
            if (((char)local_2d0 != '\0') && (local_150[0] != local_140)) {
              operator_delete(local_150[0],local_140[0] + 1);
            }
            if (((char)local_2cc != '\0') && (local_130[0] != local_120)) {
              operator_delete(local_130[0],local_120[0] + 1);
            }
            if (((char)local_2c8 != '\0') && (local_110[0] != local_100)) {
              operator_delete(local_110[0],local_100[0] + 1);
            }
            if (((char)local_2c4 != '\0') && (local_f0[0] != local_e0)) {
              operator_delete(local_f0[0],local_e0[0] + 1);
            }
            if (((char)local_2c0 != '\0') && (local_d0[0] != local_c0)) {
              operator_delete(local_d0[0],local_c0[0] + 1);
            }
            if (((char)local_2bc != '\0') && (local_b0[0] != local_a0)) {
              operator_delete(local_b0[0],local_a0[0] + 1);
            }
            if ((iStack_274 != 0) && (local_90[0] != local_80)) {
              operator_delete(local_90[0],local_80[0] + 1);
            }
            pLVar14 = (Lexer *)local_308._0_8_;
            if ((Lexer *)local_308._0_8_ != (Lexer *)(local_308 + 0x10)) {
              operator_delete((void *)local_308._0_8_,
                              (ulong)((long)(_func_int ***)local_308._16_8_ + 1));
            }
            index = 2;
            if ((bool)(bVar17 & (element_type *)0x2 < (ulong)local_2b8._8_8_)) goto LAB_001683e1;
          }
          iVar8 = std::__cxx11::string::compare((char *)local_2b8);
          if (iVar8 == 0) {
            local_318._0_4_ = 0x2f;
            std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                      ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_308,
                       (allocator<nigel::Token> *)&local_320,(Type *)local_318);
          }
          else {
            iVar8 = std::__cxx11::string::compare((char *)local_2b8);
            if (iVar8 == 0) {
              local_318._0_4_ = 0x30;
              std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
              __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                        ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_308,
                         (allocator<nigel::Token> *)&local_320,(Type *)local_318);
            }
            else {
              iVar8 = std::__cxx11::string::compare((char *)local_2b8);
              if (iVar8 == 0) {
                local_318._0_4_ = 0x31;
                std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                          ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_308,
                           (allocator<nigel::Token> *)&local_320,(Type *)local_318);
              }
              else {
                iVar8 = std::__cxx11::string::compare((char *)local_2b8);
                if (iVar8 == 0) {
                  local_318._0_4_ = 0x32;
                  std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                  __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                            ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_308,
                             (allocator<nigel::Token> *)&local_320,(Type *)local_318);
                }
                else {
                  iVar8 = std::__cxx11::string::compare((char *)local_2b8);
                  if (iVar8 == 0) {
                    local_318._0_4_ = 0x33;
                    std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                    __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                              ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_308,
                               (allocator<nigel::Token> *)&local_320,(Type *)local_318);
                  }
                  else {
                    iVar8 = std::__cxx11::string::compare((char *)local_2b8);
                    if (iVar8 == 0) {
                      local_318._0_4_ = 0x1e;
                      std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                      __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                                ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_308,
                                 (allocator<nigel::Token> *)&local_320,(Type *)local_318);
                    }
                    else {
                      iVar8 = std::__cxx11::string::compare((char *)local_2b8);
                      if (iVar8 == 0) {
                        local_318._0_4_ = 0x1f;
                        std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                        __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                                  ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)
                                   local_308,(allocator<nigel::Token> *)&local_320,(Type *)local_318
                                  );
                      }
                      else {
                        iVar8 = std::__cxx11::string::compare((char *)local_2b8);
                        if (iVar8 == 0) {
                          local_318._0_4_ = 0x22;
                          std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                          __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                                    ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)
                                     local_308,(allocator<nigel::Token> *)&local_320,
                                     (Type *)local_318);
                        }
                        else {
                          iVar8 = std::__cxx11::string::compare((char *)local_2b8);
                          if (iVar8 == 0) {
                            local_318._0_4_ = 0x23;
                            std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                            __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                                      ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)
                                       local_308,(allocator<nigel::Token> *)&local_320,
                                       (Type *)local_318);
                          }
                          else {
                            iVar8 = std::__cxx11::string::compare((char *)local_2b8);
                            if (iVar8 == 0) {
                              local_318._0_4_ = 0x36;
                              std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                              __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                                        ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)
                                         local_308,(allocator<nigel::Token> *)&local_320,
                                         (Type *)local_318);
                            }
                            else {
                              iVar8 = std::__cxx11::string::compare((char *)local_2b8);
                              if (iVar8 == 0) {
                                local_318._0_4_ = 0x37;
                                std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                                __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                                          ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)
                                           local_308,(allocator<nigel::Token> *)&local_320,
                                           (Type *)local_318);
                              }
                              else {
                                iVar8 = std::__cxx11::string::compare((char *)local_2b8);
                                if (iVar8 == 0) {
                                  local_318._0_4_ = 0x38;
                                  std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                                  __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                                            ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>
                                              *)local_308,(allocator<nigel::Token> *)&local_320,
                                             (Type *)local_318);
                                }
                                else {
                                  iVar8 = std::__cxx11::string::compare((char *)local_2b8);
                                  if (iVar8 == 0) {
                                    local_318._0_4_ = 0x28;
                                    std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                                    __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                                              ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>
                                                *)local_308,(allocator<nigel::Token> *)&local_320,
                                               (Type *)local_318);
                                  }
                                  else {
                                    iVar8 = std::__cxx11::string::compare((char *)local_2b8);
                                    if (iVar8 == 0) {
                                      local_318._0_4_ = 0x2a;
                                      std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                                      __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                                                ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>
                                                  *)local_308,(allocator<nigel::Token> *)&local_320,
                                                 (Type *)local_318);
                                    }
                                    else {
                                      iVar8 = std::__cxx11::string::compare((char *)local_2b8);
                                      if (iVar8 == 0) {
                                        local_318._0_4_ = 0x24;
                                        std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                                        __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                                                  ((
                                                  __shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>
                                                  *)local_308,(allocator<nigel::Token> *)&local_320,
                                                  (Type *)local_318);
                                      }
                                      else {
                                        iVar8 = std::__cxx11::string::compare((char *)local_2b8);
                                        if (iVar8 == 0) {
                                          local_318._0_4_ = 0x25;
                                          std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>
                                          ::
                                          __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                                                    ((
                                                  __shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>
                                                  *)local_308,(allocator<nigel::Token> *)&local_320,
                                                  (Type *)local_318);
                                        }
                                        else {
                                          iVar8 = std::__cxx11::string::compare((char *)local_2b8);
                                          if (iVar8 == 0) {
                                            local_318._0_4_ = 0x34;
                                            std::
                                            __shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                                            __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                                                      ((
                                                  __shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>
                                                  *)local_308,(allocator<nigel::Token> *)&local_320,
                                                  (Type *)local_318);
                                          }
                                          else {
                                            iVar8 = std::__cxx11::string::compare((char *)local_2b8)
                                            ;
                                            if (iVar8 == 0) {
                                              local_318._0_4_ = 0x35;
                                              std::
                                              __shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>
                                              ::
                                              __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                                                        ((
                                                  __shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>
                                                  *)local_308,(allocator<nigel::Token> *)&local_320,
                                                  (Type *)local_318);
                                            }
                                            else {
                                              iVar8 = std::__cxx11::string::compare
                                                                ((char *)local_2b8);
                                              if (iVar8 == 0) {
                                                local_318._0_4_ = 0x39;
                                                std::
                                                __shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>
                                                ::
                                                __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                                                          ((
                                                  __shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>
                                                  *)local_308,(allocator<nigel::Token> *)&local_320,
                                                  (Type *)local_318);
                                              }
                                              else {
                                                pLVar14 = (Lexer *)local_2b8;
                                                iVar8 = std::__cxx11::string::compare
                                                                  ((char *)local_2b8);
                                                if (iVar8 != 0) {
                                                  splitToken(pLVar14,(String *)local_2b8,1,
                                                             (iterator *)(local_2b8 + 0x20),
                                                             lexerStruct);
                                                  goto LAB_001685d8;
                                                }
                                                local_318._0_4_ = 0x3a;
                                                std::
                                                __shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>
                                                ::
                                                __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                                                          ((
                                                  __shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>
                                                  *)local_308,(allocator<nigel::Token> *)&local_320,
                                                  (Type *)local_318);
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          uVar10 = local_308._8_8_;
          uVar9 = local_308._0_8_;
          local_308._8_8_ = (element_type *)0x0;
          local_308._0_8_ = (Lexer *)0x0;
          p_Var15 = ((_List_node_base *)(local_2b8._32_8_ + 0x10))->_M_next;
          this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((_List_node_base *)(local_2b8._32_8_ + 0x10))->_M_prev;
          ((_List_node_base *)(local_2b8._32_8_ + 0x10))->_M_next = (_List_node_base *)uVar9;
          ((_List_node_base *)(local_2b8._32_8_ + 0x10))->_M_prev = (_List_node_base *)uVar10;
        }
        uVar9 = local_2b8._32_8_;
        if ((element_type *)local_2b8._8_8_ == (element_type *)0x1) {
          Token::as<nigel::Token_Operator>((Token *)local_318);
          local_308._0_8_ = local_308 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_308,((_List_node_base *)(local_318._0_8_ + 0x50))->_M_next,
                     (long)&((_List_node_base *)(local_318._0_8_ + 0x50))->_M_prev->_M_next +
                     (long)((_List_node_base *)(local_318._0_8_ + 0x50))->_M_next);
          if ((element_type *)local_318._8_8_ != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_318._8_8_);
          }
          iVar8 = std::__cxx11::string::compare(local_308);
          if (iVar8 == 0) {
            local_320 = op_add;
            std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                      ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_318,
                       (allocator<nigel::Token> *)&local_319,&local_320);
LAB_001690bb:
            uVar7 = local_318._8_8_;
            uVar10 = local_318._0_8_;
            local_318._0_8_ = (_List_node_base *)0x0;
            local_318._8_8_ = (element_type *)0x0;
            if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
            }
            if ((element_type *)local_318._8_8_ != (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_318._8_8_);
            }
            p_Var15 = ((_List_node_base *)(uVar9 + 0x10))->_M_next;
            this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      ((_List_node_base *)(uVar9 + 0x10))->_M_prev;
            ((_List_node_base *)(uVar9 + 0x10))->_M_next = (_List_node_base *)uVar10;
            ((_List_node_base *)(uVar9 + 0x10))->_M_prev = (_List_node_base *)uVar7;
          }
          else {
            iVar8 = std::__cxx11::string::compare(local_308);
            if (iVar8 == 0) {
              local_320 = op_sub;
              std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
              __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                        ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_318,
                         (allocator<nigel::Token> *)&local_319,&local_320);
              goto LAB_001690bb;
            }
            iVar8 = std::__cxx11::string::compare(local_308);
            if (iVar8 == 0) {
              local_320 = op_mul;
              std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
              __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                        ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_318,
                         (allocator<nigel::Token> *)&local_319,&local_320);
              goto LAB_001690bb;
            }
            iVar8 = std::__cxx11::string::compare(local_308);
            if (iVar8 == 0) {
              local_320 = op_div;
              std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
              __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                        ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_318,
                         (allocator<nigel::Token> *)&local_319,&local_320);
              goto LAB_001690bb;
            }
            iVar8 = std::__cxx11::string::compare(local_308);
            if (iVar8 == 0) {
              local_320 = op_mod;
              std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
              __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                        ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_318,
                         (allocator<nigel::Token> *)&local_319,&local_320);
              goto LAB_001690bb;
            }
            iVar8 = std::__cxx11::string::compare(local_308);
            if (iVar8 == 0) {
              local_320 = op_set;
              std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
              __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                        ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_318,
                         (allocator<nigel::Token> *)&local_319,&local_320);
              goto LAB_001690bb;
            }
            iVar8 = std::__cxx11::string::compare(local_308);
            if (iVar8 == 0) {
              local_320 = op_less;
              std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
              __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                        ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_318,
                         (allocator<nigel::Token> *)&local_319,&local_320);
              goto LAB_001690bb;
            }
            iVar8 = std::__cxx11::string::compare(local_308);
            if (iVar8 == 0) {
              local_320 = op_more;
              std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
              __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                        ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_318,
                         (allocator<nigel::Token> *)&local_319,&local_320);
              goto LAB_001690bb;
            }
            iVar8 = std::__cxx11::string::compare(local_308);
            if (iVar8 == 0) {
              local_320 = op_not;
              std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
              __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                        ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_318,
                         (allocator<nigel::Token> *)&local_319,&local_320);
              goto LAB_001690bb;
            }
            iVar8 = std::__cxx11::string::compare(local_308);
            if (iVar8 == 0) {
              local_320 = op_and;
              std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
              __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                        ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_318,
                         (allocator<nigel::Token> *)&local_319,&local_320);
              goto LAB_001690bb;
            }
            iVar8 = std::__cxx11::string::compare(local_308);
            if (iVar8 == 0) {
              local_320 = op_or;
              std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
              __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                        ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_318,
                         (allocator<nigel::Token> *)&local_319,&local_320);
              goto LAB_001690bb;
            }
            iVar8 = std::__cxx11::string::compare(local_308);
            if (iVar8 == 0) {
              local_320 = op_xor;
              std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
              __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                        ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_318,
                         (allocator<nigel::Token> *)&local_319,&local_320);
              goto LAB_001690bb;
            }
            iVar8 = std::__cxx11::string::compare(local_308);
            if (iVar8 == 0) {
              local_320 = op_inv;
              std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
              __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                        ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_318,
                         (allocator<nigel::Token> *)&local_319,&local_320);
              goto LAB_001690bb;
            }
          }
          if ((Lexer *)local_308._0_8_ != (Lexer *)(local_308 + 0x10)) {
            operator_delete((void *)local_308._0_8_,
                            (ulong)((long)(_func_int ***)local_308._16_8_ + 1));
          }
        }
      }
      else {
        if (iVar8 != 3) goto switchD_001678f1_default;
        Token::as<nigel::Token_Identifier>((Token *)local_308);
        local_2b8._0_8_ = local_2b8 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_2b8,
                   (_List_node_base *)
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_308._0_8_ + 0x50))->
                   _vptr__Sp_counted_base,
                   (long)&(*(_List_node_base **)
                            &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             (local_308._0_8_ + 0x50))->_M_use_count)->_M_next +
                   (long)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_308._0_8_ + 0x50))
                         ->_vptr__Sp_counted_base);
        if ((element_type *)local_308._8_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_308._8_8_);
        }
        iVar8 = std::__cxx11::string::compare((char *)local_2b8);
        if (iVar8 == 0) {
          local_318._0_4_ = 1;
          std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                    ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_308,
                     (allocator<nigel::Token> *)&local_320,(Type *)local_318);
        }
        else {
          iVar8 = std::__cxx11::string::compare((char *)local_2b8);
          if (iVar8 == 0) {
            local_318._0_4_ = 4;
            std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                      ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_308,
                       (allocator<nigel::Token> *)&local_320,(Type *)local_318);
          }
          else {
            iVar8 = std::__cxx11::string::compare((char *)local_2b8);
            if (iVar8 != 0) {
              iVar8 = std::__cxx11::string::compare((char *)local_2b8);
              if (iVar8 == 0) {
                local_318._0_4_ = 6;
                std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                          ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_308,
                           (allocator<nigel::Token> *)&local_320,(Type *)local_318);
                goto LAB_00168c6f;
              }
              iVar8 = std::__cxx11::string::compare((char *)local_2b8);
              if (iVar8 == 0) {
                local_318._0_4_ = 7;
                std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                          ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_308,
                           (allocator<nigel::Token> *)&local_320,(Type *)local_318);
                goto LAB_00168c6f;
              }
              iVar8 = std::__cxx11::string::compare((char *)local_2b8);
              if (iVar8 == 0) {
                local_318._0_4_ = 8;
                std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                          ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_308,
                           (allocator<nigel::Token> *)&local_320,(Type *)local_318);
                goto LAB_00168c6f;
              }
              iVar8 = std::__cxx11::string::compare((char *)local_2b8);
              if (iVar8 == 0) {
                local_318._0_4_ = 9;
                std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                          ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_308,
                           (allocator<nigel::Token> *)&local_320,(Type *)local_318);
                goto LAB_00168c6f;
              }
              iVar8 = std::__cxx11::string::compare((char *)local_2b8);
              if (iVar8 == 0) {
                local_318._0_4_ = 10;
                std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                          ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_308,
                           (allocator<nigel::Token> *)&local_320,(Type *)local_318);
                goto LAB_00168c6f;
              }
              iVar8 = std::__cxx11::string::compare((char *)local_2b8);
              if (iVar8 == 0) {
                local_318._0_4_ = 0xb;
                std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                          ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_308,
                           (allocator<nigel::Token> *)&local_320,(Type *)local_318);
                goto LAB_00168c6f;
              }
              iVar8 = std::__cxx11::string::compare((char *)local_2b8);
              if (iVar8 == 0) {
                local_318._0_4_ = 0xc;
                std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                          ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_308,
                           (allocator<nigel::Token> *)&local_320,(Type *)local_318);
                goto LAB_00168c6f;
              }
              iVar8 = std::__cxx11::string::compare((char *)local_2b8);
              if (iVar8 == 0) {
                local_318._0_4_ = 0xd;
                std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                          ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_308,
                           (allocator<nigel::Token> *)&local_320,(Type *)local_318);
                goto LAB_00168c6f;
              }
              iVar8 = std::__cxx11::string::compare((char *)local_2b8);
              if (iVar8 == 0) {
                local_318._0_4_ = 0xe;
                std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                          ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_308,
                           (allocator<nigel::Token> *)&local_320,(Type *)local_318);
                goto LAB_00168c6f;
              }
              iVar8 = std::__cxx11::string::compare((char *)local_2b8);
              if (iVar8 == 0) {
                local_318._0_4_ = 0xf;
                std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                          ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_308,
                           (allocator<nigel::Token> *)&local_320,(Type *)local_318);
                goto LAB_00168c6f;
              }
              iVar8 = std::__cxx11::string::compare((char *)local_2b8);
              if (iVar8 == 0) {
                local_318._0_4_ = 0x10;
                std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                          ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_308,
                           (allocator<nigel::Token> *)&local_320,(Type *)local_318);
                goto LAB_00168c6f;
              }
              iVar8 = std::__cxx11::string::compare((char *)local_2b8);
              if (iVar8 == 0) {
                local_318._0_4_ = 0x11;
                std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                          ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_308,
                           (allocator<nigel::Token> *)&local_320,(Type *)local_318);
                goto LAB_00168c6f;
              }
              iVar8 = std::__cxx11::string::compare((char *)local_2b8);
              if (iVar8 == 0) {
                local_318._0_4_ = 0x12;
                std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                          ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_308,
                           (allocator<nigel::Token> *)&local_320,(Type *)local_318);
                goto LAB_00168c6f;
              }
              iVar8 = std::__cxx11::string::compare((char *)local_2b8);
              if (iVar8 == 0) {
                local_318._0_4_ = 0x13;
                std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                          ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_308,
                           (allocator<nigel::Token> *)&local_320,(Type *)local_318);
                goto LAB_00168c6f;
              }
              iVar8 = std::__cxx11::string::compare((char *)local_2b8);
              if (iVar8 == 0) {
                local_318._0_4_ = 0x16;
                std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                          ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_308,
                           (allocator<nigel::Token> *)&local_320,(Type *)local_318);
                goto LAB_00168c6f;
              }
              iVar8 = std::__cxx11::string::compare((char *)local_2b8);
              if (iVar8 == 0) {
                local_318._0_4_ = 0x17;
                std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                          ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_308,
                           (allocator<nigel::Token> *)&local_320,(Type *)local_318);
                goto LAB_00168c6f;
              }
              this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              p_Var15 = (_List_node_base *)0x0;
              goto LAB_0016911d;
            }
            local_318._0_4_ = 5;
            std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                      ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_308,
                       (allocator<nigel::Token> *)&local_320,(Type *)local_318);
          }
        }
LAB_00168c6f:
        uVar10 = local_308._8_8_;
        uVar9 = local_308._0_8_;
        local_308._8_8_ = (element_type *)0x0;
        local_308._0_8_ = (Lexer *)0x0;
        p_Var15 = p_Var11[1]._M_next;
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var11[1]._M_prev;
        p_Var11[1]._M_next = (_List_node_base *)uVar9;
        p_Var11[1]._M_prev = (_List_node_base *)uVar10;
      }
LAB_0016911d:
      if ((_List_node_base *)local_2b8._0_8_ != (_List_node_base *)(local_2b8 + 0x10)) {
        operator_delete((void *)local_2b8._0_8_,(ulong)(local_2b8._16_8_ + 1));
      }
      goto switchD_0016784e_caseD_5e;
    }
    Token::as<nigel::Token_DividingToken>((Token *)local_2b8);
    bVar1 = *(byte *)&((_List_node_base *)(local_2b8._0_8_ + 0x50))->_M_next;
    if ((element_type *)local_2b8._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._8_8_);
    }
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (0x39 < bVar1) {
      if (bVar1 < 0x5b) {
        p_Var15 = (_List_node_base *)0x0;
        switch(bVar1) {
        case 0x3a:
          local_308._0_4_ = 0x46;
          std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                    ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_2b8,
                     (allocator<nigel::Token> *)local_318,(Type *)local_308);
          break;
        case 0x3b:
          local_308._0_4_ = 0x47;
          std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                    ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_2b8,
                     (allocator<nigel::Token> *)local_318,(Type *)local_308);
          break;
        case 0x3c:
        case 0x3d:
        case 0x3e:
          goto switchD_0016784e_caseD_5e;
        case 0x3f:
          local_308._0_4_ = 0x48;
          std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                    ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_2b8,
                     (allocator<nigel::Token> *)local_318,(Type *)local_308);
          break;
        case 0x40:
          local_308._0_4_ = 0x49;
          std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                    ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_2b8,
                     (allocator<nigel::Token> *)local_318,(Type *)local_308);
          break;
        default:
          goto switchD_001678f1_default;
        }
      }
      else {
        p_Var15 = (_List_node_base *)0x0;
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        switch(bVar1) {
        case 0x5b:
          local_308._0_4_ = 0x40;
          std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                    ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_2b8,
                     (allocator<nigel::Token> *)local_318,(Type *)local_308);
          break;
        case 0x5c:
          local_308._0_4_ = 0x4a;
          std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                    ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_2b8,
                     (allocator<nigel::Token> *)local_318,(Type *)local_308);
          break;
        case 0x5d:
          local_308._0_4_ = 0x41;
          std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                    ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_2b8,
                     (allocator<nigel::Token> *)local_318,(Type *)local_308);
          break;
        case 0x5e:
        case 0x5f:
          goto switchD_0016784e_caseD_5e;
        case 0x60:
          local_308._0_4_ = 0x4b;
          std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                    ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_2b8,
                     (allocator<nigel::Token> *)local_318,(Type *)local_308);
          break;
        default:
          if (bVar1 == 0x7b) {
            local_308._0_4_ = 0x42;
            std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                      ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_2b8,
                       (allocator<nigel::Token> *)local_318,(Type *)local_308);
          }
          else {
            p_Var15 = (_List_node_base *)0x0;
            if (bVar1 != 0x7d) goto switchD_0016784e_caseD_5e;
            local_308._0_4_ = 0x43;
            std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                      ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_2b8,
                       (allocator<nigel::Token> *)local_318,(Type *)local_308);
          }
        }
      }
      goto LAB_00167fde;
    }
    p_Var15 = (_List_node_base *)0x0;
    switch(bVar1) {
    case 0x23:
      local_308._0_4_ = 0x3d;
      std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_2b8,
                 (allocator<nigel::Token> *)local_318,(Type *)local_308);
      break;
    case 0x24:
      local_308._0_4_ = 0x3c;
      std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_2b8,
                 (allocator<nigel::Token> *)local_318,(Type *)local_308);
      break;
    case 0x25:
    case 0x26:
    case 0x27:
    case 0x2a:
    case 0x2b:
    case 0x2d:
      goto switchD_0016784e_caseD_5e;
    case 0x28:
      local_308._0_4_ = 0x3e;
      std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_2b8,
                 (allocator<nigel::Token> *)local_318,(Type *)local_308);
      break;
    case 0x29:
      local_308._0_4_ = 0x3f;
      std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_2b8,
                 (allocator<nigel::Token> *)local_318,(Type *)local_308);
      break;
    case 0x2c:
      local_308._0_4_ = 0x44;
      std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_2b8,
                 (allocator<nigel::Token> *)local_318,(Type *)local_308);
      break;
    case 0x2e:
      local_308._0_4_ = 0x45;
      std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_2b8,
                 (allocator<nigel::Token> *)local_318,(Type *)local_308);
      break;
    default:
switchD_001678f1_default:
      p_Var15 = (_List_node_base *)0x0;
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      goto switchD_0016784e_caseD_5e;
    }
LAB_00167fde:
    uVar10 = local_2b8._8_8_;
    uVar9 = local_2b8._0_8_;
    local_2b8._8_8_ = (element_type *)0x0;
    local_2b8._0_8_ = (_List_node_base *)0x0;
    p_Var15 = p_Var11[1]._M_next;
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var11[1]._M_prev;
    p_Var11[1]._M_next = (_List_node_base *)uVar9;
    p_Var11[1]._M_prev = (_List_node_base *)uVar10;
switchD_0016784e_caseD_5e:
    if (p_Var15 != (_List_node_base *)0x0) {
      p_Var11 = ((_List_node_base *)(local_2b8._32_8_ + 0x10))->_M_next;
      p_Var11[2]._M_next = p_Var15[2]._M_next;
      p_Var11[2]._M_prev = p_Var15[2]._M_prev;
      p_Var11[3]._M_next = p_Var15[3]._M_next;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p_Var11[3]._M_prev,
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p_Var15[3]._M_prev);
      p_Var11 = ((_List_node_base *)(local_2b8._32_8_ + 0x10))->_M_next;
      p_Var11[4]._M_next = p_Var15[4]._M_next;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p_Var11[4]._M_prev,
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p_Var15[4]._M_prev);
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    uVar9 = local_2b8._32_8_;
    if (*(int *)&((_List_node_base *)(local_2b8._32_8_ + 0x10))->_M_next[1]._M_prev == 0) {
      p_Var11 = (_List_node_base *)operator_new(0x18);
      p_Var11[1]._M_next = (_List_node_base *)local_2b8._32_8_;
      std::__detail::_List_node_base::_M_hook(p_Var11);
      local_280._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((long)&(local_280._M_pi)->_vptr__Sp_counted_base + 1);
    }
    p_Var11 = *(_List_node_base **)uVar9;
    peVar13 = (element_type *)local_2b8._40_8_;
  } while( true );
}

Assistant:

ExecutionResult Lexer::postLexer( CodeBase &base )
	{
		std::shared_ptr<Token> tmp, tmp2;
		std::list<std::list<std::shared_ptr<Token>>::iterator> toRemove;

		for( auto token = base.lexerStruct.begin() ; token != base.lexerStruct.end() ; token++ )
		{
			if( ( *token )->type == Token::Type::identifier )
			{//Specify some tokens in more detail
				String identifier = ( *token )->as<Token_Identifier>()->identifier;

				if( identifier == "_EOF_" )
				{
					tmp = std::make_shared<Token>( Token::Type::eof );
					token->swap( tmp );
				}
				else if( identifier == "fn" )
				{
					tmp = std::make_shared<Token>( Token::Type::function );
					token->swap( tmp );
				}
				else if( identifier == "byte" )
				{
					tmp = std::make_shared<Token>( Token::Type::type_byte );
					token->swap( tmp );
				}
				else if( identifier == "int" )
				{
					tmp = std::make_shared<Token>( Token::Type::type_int );
					token->swap( tmp );
				}
				else if( identifier == "unsigned" )
				{
					tmp = std::make_shared<Token>( Token::Type::unsigned_attr );
					token->swap( tmp );
				}
				else if( identifier == "fast" )
				{
					tmp = std::make_shared<Token>( Token::Type::fast_attr );
					token->swap( tmp );
				}
				else if( identifier == "norm" )
				{
					tmp = std::make_shared<Token>( Token::Type::norm_attr );
					token->swap( tmp );
				}
				else if( identifier == "ptr" )
				{
					tmp = std::make_shared<Token>( Token::Type::type_ptr );
					token->swap( tmp );
				}
				else if( identifier == "if" )
				{
					tmp = std::make_shared<Token>( Token::Type::cf_if );
					token->swap( tmp );
				}
				else if( identifier == "else" )
				{
					tmp = std::make_shared<Token>( Token::Type::cf_else );
					token->swap( tmp );
				}
				else if( identifier == "while" )
				{
					tmp = std::make_shared<Token>( Token::Type::cf_while );
					token->swap( tmp );
				}
				else if( identifier == "for" )
				{
					tmp = std::make_shared<Token>( Token::Type::cf_for );
					token->swap( tmp );
				}
				else if( identifier == "do" )
				{
					tmp = std::make_shared<Token>( Token::Type::cf_do );
					token->swap( tmp );
				}
				else if( identifier == "break" )
				{
					tmp = std::make_shared<Token>( Token::Type::cf_break );
					token->swap( tmp );
				}
				else if( identifier == "return" )
				{
					tmp = std::make_shared<Token>( Token::Type::cf_return );
					token->swap( tmp );
				}
				else if( identifier == "new" )
				{
					tmp = std::make_shared<Token>( Token::Type::dy_new );
					token->swap( tmp );
				}
				else if( identifier == "delete" )
				{
					tmp = std::make_shared<Token>( Token::Type::dy_delete );
					token->swap( tmp );
				}
				else if( identifier == "true" )
				{
					tmp = std::make_shared<Token>( Token::Type::literalTrue );
					token->swap( tmp );
				}
				else if( identifier == "false" )
				{
					tmp = std::make_shared<Token>( Token::Type::literalFalse );
					token->swap( tmp );
				}
			}
			else if( ( *token )->type == Token::Type::operatorToken )
			{
				String identifier = ( *token )->as<Token_Operator>()->operatorToken;

				if( identifier.size() > 1 )
				{//May have to be splitted
					if( identifier.substr( 0, 3 ) == "<<=" || identifier.substr( 0, 3 ) == ">>=" )
					{
						if( identifier.size() > 3 )
						{//Split
							splitToken( identifier, 3, token, base.lexerStruct );
						}
					}
					else if( identifier.substr( 0, 2 ) == "&&" || identifier.substr( 0, 2 ) == "||" || identifier.substr( 0, 2 ) == "<<" || identifier.substr( 0, 2 ) == ">>" || identifier.substr( 0, 2 ) == ">=" || identifier.substr( 0, 2 ) == "<=" || identifier.substr( 0, 2 ) == "++" || identifier.substr( 0, 2 ) == "--" || identifier.substr( 0, 2 ) == "==" || identifier.substr( 0, 2 ) == "!=" || identifier.substr( 0, 2 ) == "+=" || identifier.substr( 0, 2 ) == "-=" || identifier.substr( 0, 2 ) == "*=" || identifier.substr( 0, 2 ) == "/=" || identifier.substr( 0, 2 ) == "%=" || identifier.substr( 0, 2 ) == "&=" || identifier.substr( 0, 2 ) == "|=" || identifier.substr( 0, 2 ) == "^=" )
					{
						if( identifier.size() > 2 )
						{//Split
							splitToken( identifier, 2, token, base.lexerStruct );
						}
					}

					if( identifier == "+=" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_add_set );
						token->swap( tmp );
					}
					else if( identifier == "-=" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_sub_set );
						token->swap( tmp );
					}
					else if( identifier == "*=" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_mul_set );
						token->swap( tmp );
					}
					else if( identifier == "/=" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_div_set );
						token->swap( tmp );
					}
					else if( identifier == "%=" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_mod_set );
						token->swap( tmp );
					}
					else if( identifier == "==" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_eql );
						token->swap( tmp );
					}
					else if( identifier == "!=" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_not_eql );
						token->swap( tmp );
					}
					else if( identifier == "<=" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_less_eql );
						token->swap( tmp );
					}
					else if( identifier == ">=" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_more_eql );
						token->swap( tmp );
					}
					else if( identifier == "&=" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_and_set );
						token->swap( tmp );
					}
					else if( identifier == "|=" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_or_set );
						token->swap( tmp );
					}
					else if( identifier == "^=" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_xor_set );
						token->swap( tmp );
					}
					else if( identifier == "&&" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_and_log );
						token->swap( tmp );
					}
					else if( identifier == "||" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_or_log );
						token->swap( tmp );
					}
					else if( identifier == "<<" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_shift_left );
						token->swap( tmp );
					}
					else if( identifier == ">>" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_shift_right );
						token->swap( tmp );
					}
					else if( identifier == "<<=" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_shift_left_set );
						token->swap( tmp );
					}
					else if( identifier == ">>=" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_shift_right_set );
						token->swap( tmp );
					}
					else if( identifier == "++" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_inc );
						token->swap( tmp );
					}
					else if( identifier == "--" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_dec );
						token->swap( tmp );
					}
					else
					{//Split
						splitToken( identifier, 1, token, base.lexerStruct );
					}
				}
				if( identifier.size() == 1 )
				{//Single char operators
					String identifier = ( *token )->as<Token_Operator>()->operatorToken;

					if( identifier == "+" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_add );
						token->swap( tmp );
					}
					else if( identifier == "-" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_sub );
						token->swap( tmp );
					}
					else if( identifier == "*" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_mul );
						token->swap( tmp );
					}
					else if( identifier == "/" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_div );
						token->swap( tmp );
					}
					else if( identifier == "%" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_mod );
						token->swap( tmp );
					}
					else if( identifier == "=" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_set );
						token->swap( tmp );
					}
					else if( identifier == "<" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_less );
						token->swap( tmp );
					}
					else if( identifier == ">" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_more );
						token->swap( tmp );
					}
					else if( identifier == "!" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_not );
						token->swap( tmp );
					}
					else if( identifier == "&" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_and );
						token->swap( tmp );
					}
					else if( identifier == "|" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_or );
						token->swap( tmp );
					}
					else if( identifier == "^" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_xor );
						token->swap( tmp );
					}
					else if( identifier == "~" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_inv );
						token->swap( tmp );
					}
				}
			}
			else if( ( *token )->type == Token::Type::dividingToken )
			{
				u8 t = ( *token )->as<Token_DividingToken>()->token;

				if( t == '$' )
				{
					tmp = std::make_shared<Token>( Token::Type::tok_dollar );
					token->swap( tmp );
				}
				else if( t == '#' )
				{
					tmp = std::make_shared<Token>( Token::Type::tok_hash );
					token->swap( tmp );
				}
				else if( t == '(' )
				{
					tmp = std::make_shared<Token>( Token::Type::tok_parenthesis_open );
					token->swap( tmp );
				}
				else if( t == ')' )
				{
					tmp = std::make_shared<Token>( Token::Type::tok_parenthesis_close );
					token->swap( tmp );
				}
				else if( t == '[' )
				{
					tmp = std::make_shared<Token>( Token::Type::tok_bracket_open );
					token->swap( tmp );
				}
				else if( t == ']' )
				{
					tmp = std::make_shared<Token>( Token::Type::tok_bracket_close );
					token->swap( tmp );
				}
				else if( t == '{' )
				{
					tmp = std::make_shared<Token>( Token::Type::tok_brace_open );
					token->swap( tmp );
				}
				else if( t == '}' )
				{
					tmp = std::make_shared<Token>( Token::Type::tok_brace_close );
					token->swap( tmp );
				}
				else if( t == ',' )
				{
					tmp = std::make_shared<Token>( Token::Type::tok_comma );
					token->swap( tmp );
				}
				else if( t == '.' )
				{
					tmp = std::make_shared<Token>( Token::Type::tok_period );
					token->swap( tmp );
				}
				else if( t == ':' )
				{
					tmp = std::make_shared<Token>( Token::Type::tok_colon );
					token->swap( tmp );
				}
				else if( t == ';' )
				{
					tmp = std::make_shared<Token>( Token::Type::tok_semicolon );
					token->swap( tmp );
				}
				else if( t == '?' )
				{
					tmp = std::make_shared<Token>( Token::Type::tok_questionmark );
					token->swap( tmp );
				}
				else if( t == '@' )
				{
					tmp = std::make_shared<Token>( Token::Type::tok_at );
					token->swap( tmp );
				}
				else if( t == '\\' )
				{
					tmp = std::make_shared<Token>( Token::Type::tok_backslash );
					token->swap( tmp );
				}
				else if( t == '`' )
				{
					tmp = std::make_shared<Token>( Token::Type::tok_grave );
					token->swap( tmp );
				}
			}
			if( tmp != nullptr )
			{//Move also metadata. Use inverted order because of swap
				( *token )->lineNo = tmp->lineNo;
				( *token )->columnNo = tmp->columnNo;
				( *token )->line = tmp->line;
				( *token )->path = tmp->path;
			}
			tmp = nullptr;

			if( ( *token )->type == Token::Type::empty )
			{
				toRemove.push_back( token );
			}
		}

		//Remove empty token, if any
		for( auto &remove : toRemove )
		{
			base.lexerStruct.erase( remove );
		}

		return ExecutionResult::success;
	}